

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimstate.cpp
# Opt level: O3

void __thiscall BtorSimState::update(BtorSimState *this,BtorSimState *s)

{
  anon_union_8_2_8be7de1a_for_BtorSimState_2 aVar1;
  
  if (this->type == BITVEC) {
    aVar1 = s->field_1;
    if ((this->field_1).bv_state != (BtorSimBitVector *)0x0) {
      btorsim_bv_free((this->field_1).bv_state);
    }
    this->field_1 = aVar1;
    return;
  }
  if (this->type == ARRAY) {
    update(this,(s->field_1).array_state);
    return;
  }
  die("Updating invalid state!");
  return;
}

Assistant:

void
BtorSimState::update (BtorSimState &s)
{
  switch (type)
  {
    case ARRAY:
      assert (s.type == ARRAY);
      update (s.array_state);
      break;
    case BtorSimState::Type::BITVEC:
      assert (s.type == BITVEC);
      update (s.bv_state);
      break;
    default: die ("Updating invalid state!");
  }
}